

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall wasm::OptimizeInstructions::visitCallRef(OptimizeInstructions *this,CallRef *curr)

{
  Expression **input;
  Id IVar1;
  Module *pMVar2;
  Expression *target;
  PassRunner *pPVar3;
  Module *module;
  pointer puVar4;
  Function *this_00;
  Name table;
  undefined1 auVar5 [16];
  undefined8 this_01;
  Builder BVar6;
  bool bVar7;
  Index index;
  CallIndirect *rep;
  Module *pMVar8;
  Expression **ppEVar9;
  HeapType HVar10;
  HeapType HVar11;
  Type TVar12;
  LocalGet *get;
  Block *pBVar13;
  Drop *left;
  Call *right;
  Type in_R8;
  pointer *ppuVar14;
  initializer_list<wasm::Expression_*> local_b8;
  undefined1 local_a8 [64];
  Module *local_68;
  __uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> local_60;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_58;
  Builder local_40;
  Builder builder;
  
  input = &curr->target;
  skipNonNullCast(this,input,(Expression *)curr);
  bVar7 = trapOnNull(this,(Expression *)curr,input);
  if (bVar7) {
    return;
  }
  pMVar2 = (Module *)*input;
  if (((Type *)&(pMVar2->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->id == 1) {
    return;
  }
  IVar1 = *(Id *)&(pMVar2->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  if (IVar1 == TableGetId) {
    local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(this->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).
                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .
                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .currModule;
    table.super_IString.str =
         *(IString *)
          &(pMVar2->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    target = (Expression *)
             (pMVar2->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    builder.wasm = (Module *)&curr->operands;
    HVar10 = wasm::Type::getHeapType
                       ((Type *)&(pMVar2->exports).
                                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
    rep = Builder::makeCallIndirect<ArenaVector<wasm::Expression*>>
                    ((Builder *)&local_58,table,target,
                     (ArenaVector<wasm::Expression_*> *)builder.wasm,HVar10,curr->isReturn);
  }
  else if (IVar1 == RefFuncId) {
    local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(this->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).
                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .
                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .currModule;
    rep = (CallIndirect *)
          Builder::makeCall<ArenaVector<wasm::Expression*>>
                    ((Builder *)&local_58,
                     (IString)*(IString *)
                               &(pMVar2->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,&curr->operands,
                     (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)56>).
                           super_Expression.type.id,curr->isReturn);
  }
  else {
    pPVar3 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).super_Pass.runner;
    module = (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
    local_68 = (Module *)CONCAT44(local_68._4_4_,(module->features).features);
    local_a8._56_8_ = this;
    builder.wasm = (Module *)curr;
    do {
      pMVar8 = pMVar2;
      local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar8;
      ppEVar9 = Properties::getImmediateFallthroughPtr
                          ((Expression **)&local_58,&pPVar3->options,module,AllowTeeBrIf);
      this = (OptimizeInstructions *)local_a8._56_8_;
      pMVar2 = (Module *)*ppEVar9;
    } while ((Module *)*ppEVar9 != pMVar8);
    if (*(Id *)&(pMVar8->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == RefFuncId) {
      HVar10 = wasm::Type::getHeapType(&(*input)->type);
      HVar11 = wasm::Type::getHeapType
                         ((Type *)&(pMVar8->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
      BVar6 = builder;
      this_01 = local_a8._56_8_;
      if (HVar10.id != HVar11.id) {
        return;
      }
      local_40.wasm =
           (((WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
              *)local_a8._56_8_)->
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           ).
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .currModule;
      puVar4 = ((builder.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (puVar4 == (pointer)0x0) {
        left = Builder::makeDrop(&local_40,
                                 (Expression *)
                                 ((builder.wasm)->globals).
                                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        right = Builder::makeCall(&local_40,
                                  (IString)*(IString *)
                                            &(pMVar8->exports).
                                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  &local_58,
                                  (Type)((BVar6.wasm)->exports).
                                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                                  *(bool *)&((BVar6.wasm)->globals).
                                            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish);
        pBVar13 = Builder::makeSequence(&local_40,(Expression *)left,(Expression *)right);
        replaceCurrent((OptimizeInstructions *)this_01,(Expression *)pBVar13);
        if (local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          return;
        }
        operator_delete(local_58.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        return;
      }
      ppuVar14 = &((builder.wasm)->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_60._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
           (*ppuVar14)
           [(long)((long)&puVar4[-1]._M_t.
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t + 7)]._M_t.
           super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t;
      TVar12.id = ((Type *)((long)local_60._M_t.
                                  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                  .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 8))->
                  id;
      if (TVar12.id == 1) {
        return;
      }
      bVar7 = TypeUpdating::canHandleAsLocal(TVar12);
      if (!bVar7) {
        return;
      }
      this_00 = (((WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   *)this_01)->
                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                ).
                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                .currFunction;
      local_a8._40_8_ = TVar12.id;
      local_a8._48_8_ = ppuVar14;
      TVar12 = TypeUpdating::getValidLocalType(TVar12,local_68._0_4_);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = TVar12.id;
      index = Builder::addVar((Builder *)this_00,(Function *)0x0,(Name)(auVar5 << 0x40),in_R8);
      local_68 = (Module *)
                 Builder::makeLocalSet
                           (&local_40,index,
                            (Expression *)
                            local_60._M_t.
                            super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                            .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
      local_60._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
           (tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)
           Builder::makeDrop(&local_40,
                             (Expression *)
                             ((builder.wasm)->globals).
                             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      get = (LocalGet *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
      BVar6 = builder;
      (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id = LocalGetId;
      get->index = index;
      (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
           local_a8._40_8_;
      local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)TypeUpdating::fixLocalGet
                              (get,(((WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                      *)this_01)->
                                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                   ).
                                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                   .currModule);
      local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_68;
      local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_60._M_t.
                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      local_b8._M_len = 3;
      local_b8._M_array = (iterator)&local_58;
      pBVar13 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                          (&local_40,&local_b8);
      puVar4 = ((BVar6.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (puVar4 == (pointer)0x0) {
        __assert_fail("usedElements > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xd0,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      ((BVar6.wasm)->exports).
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage
      [(long)((long)&puVar4[-1]._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t + 7)]._M_t.
      super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl = (Export *)pBVar13;
      rep = (CallIndirect *)
            Builder::makeCall<ArenaVector<wasm::Expression*>>
                      (&local_40,
                       (IString)*(IString *)
                                 &(pMVar8->exports).
                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (ArenaVector<wasm::Expression_*> *)local_a8._48_8_,
                       (Type)((BVar6.wasm)->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                       *(bool *)&((BVar6.wasm)->globals).
                                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
      this = (OptimizeInstructions *)local_a8._56_8_;
    }
    else {
      local_a8._0_8_ = 0;
      local_a8._8_8_ = 0;
      local_a8._24_8_ =
           std::
           _Function_handler<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp:1393:11)>
           ::_M_invoke;
      local_a8._16_8_ =
           std::
           _Function_handler<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp:1393:11)>
           ::_M_manager;
      rep = (CallIndirect *)
            CallUtils::convertToDirectCalls<wasm::CallRef>
                      ((CallUtils *)builder.wasm,(CallRef *)local_a8,
                       (function<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*)>
                        *)(((WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                             *)local_a8._56_8_)->
                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          ).
                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .currFunction,
                       (Function *)
                       (((WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                          *)local_a8._56_8_)->
                       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       ).
                       super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       .currModule,(Module *)in_R8.id);
      if ((Expression **)local_a8._16_8_ != (Expression **)0x0) {
        (*(code *)local_a8._16_8_)(local_a8,local_a8,3);
      }
      if (rep == (CallIndirect *)0x0) {
        return;
      }
    }
  }
  replaceCurrent(this,(Expression *)rep);
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
    skipNonNullCast(curr->target, curr);
    if (trapOnNull(curr, curr->target)) {
      return;
    }
    if (curr->target->type == Type::unreachable) {
      // The call_ref is not reached; leave this for DCE.
      return;
    }

    if (auto* ref = curr->target->dynCast<RefFunc>()) {
      // We know the target!
      replaceCurrent(
        Builder(*getModule())
          .makeCall(ref->func, curr->operands, curr->type, curr->isReturn));
      return;
    }

    if (auto* get = curr->target->dynCast<TableGet>()) {
      // (call_ref ..args.. (table.get $table (index))
      //   =>
      // (call_indirect $table ..args.. (index))
      replaceCurrent(Builder(*getModule())
                       .makeCallIndirect(get->table,
                                         get->index,
                                         curr->operands,
                                         get->type.getHeapType(),
                                         curr->isReturn));
      return;
    }

    auto features = getModule()->features;

    // It is possible the target is not a function reference, but we can infer
    // the fallthrough value there. It takes more work to optimize this case,
    // but it is pretty important to allow a call_ref to become a fast direct
    // call, so make the effort.
    if (auto* ref = Properties::getFallthrough(
                      curr->target, getPassOptions(), *getModule())
                      ->dynCast<RefFunc>()) {
      // Check if the fallthrough make sense. We may have cast it to a different
      // type, which would be a problem - we'd be replacing a call_ref to one
      // type with a direct call to a function of another type. That would trap
      // at runtime; be careful not to emit invalid IR here.
      if (curr->target->type.getHeapType() != ref->type.getHeapType()) {
        return;
      }
      Builder builder(*getModule());
      if (curr->operands.empty()) {
        // No operands, so this is simple and there is nothing to reorder: just
        // emit:
        //
        // (block
        //  (drop curr->target)
        //  (call ref.func-from-curr->target)
        // )
        replaceCurrent(builder.makeSequence(
          builder.makeDrop(curr->target),
          builder.makeCall(ref->func, {}, curr->type, curr->isReturn)));
        return;
      }

      // In the presence of operands, we must execute the code in curr->target
      // after the last operand and before the call happens. Interpose at the
      // last operand:
      //
      // (call ref.func-from-curr->target)
      //  (operand1)
      //  (..)
      //  (operandN-1)
      //  (block
      //   (local.set $temp (operandN))
      //   (drop curr->target)
      //   (local.get $temp)
      //  )
      // )
      auto* lastOperand = curr->operands.back();
      auto lastOperandType = lastOperand->type;
      if (lastOperandType == Type::unreachable) {
        // The call_ref is not reached; leave this for DCE.
        return;
      }
      if (!TypeUpdating::canHandleAsLocal(lastOperandType)) {
        // We cannot create a local, so we must give up.
        return;
      }
      Index tempLocal = builder.addVar(
        getFunction(),
        TypeUpdating::getValidLocalType(lastOperandType, features));
      auto* set = builder.makeLocalSet(tempLocal, lastOperand);
      auto* drop = builder.makeDrop(curr->target);
      auto* get = TypeUpdating::fixLocalGet(
        builder.makeLocalGet(tempLocal, lastOperandType), *getModule());
      curr->operands.back() = builder.makeBlock({set, drop, get});
      replaceCurrent(builder.makeCall(
        ref->func, curr->operands, curr->type, curr->isReturn));
      return;
    }

    // If the target is a select of two different constants, we can emit an if
    // over two direct calls.
    if (auto* calls = CallUtils::convertToDirectCalls(
          curr,
          [](Expression* target) -> CallUtils::IndirectCallInfo {
            if (auto* refFunc = target->dynCast<RefFunc>()) {
              return CallUtils::Known{refFunc->func};
            }
            return CallUtils::Unknown{};
          },
          *getFunction(),
          *getModule())) {
      replaceCurrent(calls);
    }
  }